

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagholder.cpp
# Opt level: O2

void __thiscall camp::TagHolder::TagHolder(TagHolder *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_TagHolder = (_func_int **)&PTR__TagHolder_001411f0;
  p_Var1 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

TagHolder::TagHolder()
{
}